

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readBodyFast
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *rb)

{
  longlong *plVar1;
  char *pcVar2;
  QByteArray *in_RSI;
  QByteDataBuffer *in_RDI;
  long in_FS_OFFSET;
  qint64 haveRead;
  QByteArray bd;
  qint64 toBeRead;
  QByteArray *in_stack_ffffffffffffff80;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  longlong local_18;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (**(code **)&(in_RSI->d).d[10].super_QArrayData)();
  local_20 = in_RDI[6].bufferCompleteSize - in_RDI[6].firstPos;
  plVar1 = qMin<long_long>(&local_18,&local_20);
  local_10 = *plVar1;
  if (in_RDI[8].buffers.d.size != 0) {
    plVar1 = qMin<long_long>(&local_10,&in_RDI[8].buffers.d.size);
    local_10 = *plVar1;
  }
  if (local_10 == 0) {
    local_40 = 0;
  }
  else {
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x305f9b);
    QByteArray::resize((longlong)&local_38);
    pcVar2 = QByteArray::data(in_stack_ffffffffffffff80);
    local_40 = QIODevice::read((char *)in_RSI,(longlong)pcVar2);
    if (local_40 == -1) {
      QByteArray::clear();
      local_40 = 0;
    }
    else {
      QByteArray::resize((longlong)&local_38);
      QByteDataBuffer::append(in_RDI,in_RSI);
      if (in_RDI[6].firstPos + local_40 == in_RDI[6].bufferCompleteSize) {
        *(undefined4 *)&in_RDI[5].buffers.d.ptr = 4;
      }
      in_RDI[6].firstPos = local_40 + in_RDI[6].firstPos;
    }
    QByteArray::~QByteArray((QByteArray *)0x306075);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBodyFast(QIODevice *socket, QByteDataBuffer *rb)
{

    qint64 toBeRead = qMin(socket->bytesAvailable(), bodyLength - contentRead);
    if (readBufferMaxSize)
        toBeRead = qMin(toBeRead, readBufferMaxSize);

    if (!toBeRead)
        return 0;

    QByteArray bd;
    bd.resize(toBeRead);
    qint64 haveRead = socket->read(bd.data(), toBeRead);
    if (haveRead == -1) {
        bd.clear();
        return 0; // ### error checking here;
    }
    bd.resize(haveRead);

    rb->append(bd);

    if (contentRead + haveRead == bodyLength) {
        state = AllDoneState;
    }

    contentRead += haveRead;
    return haveRead;
}